

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void fftBRInit(long M,short *BRLow)

{
  long lVar1;
  long lVar2;
  long bit;
  long bitmask;
  long bitsum;
  long i1;
  long Nroot_1;
  long Mroot_1;
  short *BRLow_local;
  long M_local;
  
  lVar1 = M / 2 + -1;
  lVar2 = 1L << ((byte)lVar1 & 0x3f);
  for (i1 = 0; i1 < lVar2; i1 = i1 + 1) {
    bitsum = 0;
    bitmask = 1;
    for (bit = 1; bit <= lVar1; bit = bit + 1) {
      if ((i1 & bitmask) != 0) {
        bitsum = bitsum + (lVar2 >> ((byte)bit & 0x3f));
      }
      bitmask = bitmask << 1;
    }
    BRLow[i1] = (short)bitsum;
  }
  return;
}

Assistant:

void fftBRInit(long M, short *BRLow){
/* Compute BRLow, the bit reversed table for ffts	*/
/* of size pow(2,M/2 -1)	*/
/* INPUTS */
/* M = log2 of fft size	*/
/* OUTPUTS */
/* *BRLow = bit reversed counter table	*/
long	Mroot_1 = M / 2 - 1;
long	Nroot_1 = POW2(Mroot_1);
long i1;
long bitsum;
long bitmask;
long bit;
for (i1 = 0; i1 < Nroot_1; i1++){
	bitsum = 0;
	bitmask = 1;
	for (bit=1; bit <= Mroot_1; bitmask<<=1, bit++)
		if (i1 & bitmask)
			bitsum = bitsum + (Nroot_1 >> bit);
	BRLow[i1] = bitsum;
};
}